

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

void VP8LBitsEntropyUnrefined(uint32_t *array,int n,VP8LBitEntropy *entropy)

{
  VP8LBitEntropy *in_RDX;
  int in_ESI;
  long in_RDI;
  float fVar1;
  int i;
  uint32_t local_1c;
  
  VP8LBitEntropyInit(in_RDX);
  for (local_1c = 0; (int)local_1c < in_ESI; local_1c = local_1c + 1) {
    if (*(int *)(in_RDI + (long)(int)local_1c * 4) != 0) {
      in_RDX->sum = *(int *)(in_RDI + (long)(int)local_1c * 4) + in_RDX->sum;
      in_RDX->nonzero_code = local_1c;
      in_RDX->nonzeros = in_RDX->nonzeros + 1;
      fVar1 = VP8LFastSLog2(0);
      in_RDX->entropy = in_RDX->entropy - (double)fVar1;
      if (in_RDX->max_val < *(uint *)(in_RDI + (long)(int)local_1c * 4)) {
        in_RDX->max_val = *(uint32_t *)(in_RDI + (long)(int)local_1c * 4);
      }
    }
  }
  fVar1 = VP8LFastSLog2(0);
  in_RDX->entropy = (double)fVar1 + in_RDX->entropy;
  return;
}

Assistant:

void VP8LBitsEntropyUnrefined(const uint32_t* const array, int n,
                              VP8LBitEntropy* const entropy) {
  int i;

  VP8LBitEntropyInit(entropy);

  for (i = 0; i < n; ++i) {
    if (array[i] != 0) {
      entropy->sum += array[i];
      entropy->nonzero_code = i;
      ++entropy->nonzeros;
      entropy->entropy -= VP8LFastSLog2(array[i]);
      if (entropy->max_val < array[i]) {
        entropy->max_val = array[i];
      }
    }
  }
  entropy->entropy += VP8LFastSLog2(entropy->sum);
}